

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move3.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ostream *poVar1;
  Moveable a;
  HugeMem local_18;
  
  getTemp();
  *(uint *)(_ITM_deregisterTMCloneTable + *(long *)(std::cout + -0x18)) =
       *(uint *)(_ITM_deregisterTMCloneTable + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
  poVar1 = std::operator<<((ostream *)&std::cout,"Huge Mem from ");
  poVar1 = std::operator<<(poVar1,"main");
  poVar1 = std::operator<<(poVar1," @");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  HugeMem::~HugeMem(&local_18);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	Moveable a(getTemp());
	std::cout << std::hex << "Huge Mem from " << __func__
			  << " @" << a.h.c << std::endl;
	return 0;
}